

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall wabt::Var::set_name(Var *this,string_view name)

{
  undefined1 local_48 [8];
  string_view name_local;
  undefined1 local_28 [16];
  
  name_local.data_ = (char *)name.size_;
  local_48 = (undefined1  [8])name.data_;
  string_view::to_string_abi_cxx11_((string *)&name_local.size_,(string_view *)local_48);
  set_name(this,(string *)&name_local.size_);
  if ((undefined1 *)name_local.size_ != local_28) {
    operator_delete((void *)name_local.size_);
  }
  return;
}

Assistant:

void Var::set_name(string_view name) {
  set_name(name.to_string());
}